

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall
node::BlockManager::FindFilesToPruneManual
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune,
          int nManualPruneHeight,Chainstate *chain,ChainstateManager *chainman)

{
  long lVar1;
  pointer pCVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  pair<int,_int> pVar5;
  Logger *pLVar6;
  int iVar7;
  int fileNumber;
  int *args_2;
  int iVar8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  ChainstateRole local_110;
  int count;
  pair<int,_int> local_108;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((nManualPruneHeight < 1) || (this->m_prune_mode == false)) {
    __assert_fail("IsPruneMode() && nManualPruneHeight > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                  ,0x116,
                  "void node::BlockManager::FindFilesToPruneManual(std::set<int> &, int, const Chainstate &, ChainstateManager &)"
                 );
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x118,false);
  args_2 = (int *)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&this->cs_LastBlockFile,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
             ,0x118,false);
  if (0 < (int)((ulong)((long)(chain->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(chain->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    pVar5 = ChainstateManager::GetPruneRange(chainman,chain,nManualPruneHeight);
    count = 0;
    iVar8 = 0;
    fileNumber = 0;
    local_108 = pVar5;
    while( true ) {
      log_msg._M_dataplus._M_p._0_4_ = fileNumber;
      iVar4 = 0;
      if ((this->m_blockfile_cursors)._M_elems[0].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
        iVar4 = (this->m_blockfile_cursors)._M_elems[0].
                super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
      }
      iVar7 = 0;
      if ((this->m_blockfile_cursors)._M_elems[1].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
        iVar7 = (this->m_blockfile_cursors)._M_elems[1].
                super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
      }
      if (iVar7 < iVar4) {
        iVar7 = iVar4;
      }
      if (iVar7 <= fileNumber) break;
      pCVar2 = (this->m_blockfile_info).
               super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((pCVar2[fileNumber].nSize != 0) && (pCVar2[fileNumber].nHeightLast <= (uint)pVar5.second)
          ) && ((uint)pVar5.first <= pCVar2[fileNumber].nHeightFirst)) {
        PruneOneBlockFile(this,fileNumber);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   setFilesToPrune,(int *)&log_msg);
        iVar8 = iVar8 + 1;
        fileNumber = (int)log_msg._M_dataplus._M_p;
        count = iVar8;
      }
      fileNumber = fileNumber + 1;
    }
    local_110 = Chainstate::GetRole(chain);
    pLVar6 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar6);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<ChainstateRole,int,int>
                (&local_78,
                 (tinyformat *)"[%s] Prune (Manual): prune_height=%d removed %d blk/rev pairs\n",
                 (char *)&local_110,(ChainstateRole *)&local_108.second,&count,args_2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar6 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x5e;
      local_78._M_string_length = 0xcb2cf4;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "FindFilesToPruneManual";
      logging_function._M_len = 0x16;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,299,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::FindFilesToPruneManual(
    std::set<int>& setFilesToPrune,
    int nManualPruneHeight,
    const Chainstate& chain,
    ChainstateManager& chainman)
{
    assert(IsPruneMode() && nManualPruneHeight > 0);

    LOCK2(cs_main, cs_LastBlockFile);
    if (chain.m_chain.Height() < 0) {
        return;
    }

    const auto [min_block_to_prune, last_block_can_prune] = chainman.GetPruneRange(chain, nManualPruneHeight);

    int count = 0;
    for (int fileNumber = 0; fileNumber < this->MaxBlockfileNum(); fileNumber++) {
        const auto& fileinfo = m_blockfile_info[fileNumber];
        if (fileinfo.nSize == 0 || fileinfo.nHeightLast > (unsigned)last_block_can_prune || fileinfo.nHeightFirst < (unsigned)min_block_to_prune) {
            continue;
        }

        PruneOneBlockFile(fileNumber);
        setFilesToPrune.insert(fileNumber);
        count++;
    }
    LogPrintf("[%s] Prune (Manual): prune_height=%d removed %d blk/rev pairs\n",
        chain.GetRole(), last_block_can_prune, count);
}